

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void page_flush_tb_1(uc_struct_conflict15 *uc,int level,void **lp)

{
  void *pvVar1;
  void **pp;
  PageDesc *pd;
  int i;
  void **lp_local;
  int level_local;
  uc_struct_conflict15 *uc_local;
  
  if (*lp != (void *)0x0) {
    if (level == 0) {
      pvVar1 = *lp;
      for (pd._4_4_ = 0; pd._4_4_ < 0x400; pd._4_4_ = pd._4_4_ + 1) {
        page_lock((PageDesc *)((long)pvVar1 + (long)pd._4_4_ * 0x18));
        *(undefined8 *)((long)pvVar1 + (long)pd._4_4_ * 0x18) = 0;
        invalidate_page_bitmap((PageDesc *)((long)pvVar1 + (long)pd._4_4_ * 0x18));
        page_unlock((PageDesc *)((long)pvVar1 + (long)pd._4_4_ * 0x18));
      }
    }
    else {
      pvVar1 = *lp;
      for (pd._4_4_ = 0; pd._4_4_ < 0x400; pd._4_4_ = pd._4_4_ + 1) {
        page_flush_tb_1(uc,level + -1,(void **)((long)pvVar1 + (long)pd._4_4_ * 8));
      }
    }
  }
  return;
}

Assistant:

static void page_flush_tb_1(struct uc_struct *uc, int level, void **lp)
{
    int i;

    if (*lp == NULL) {
        return;
    }
    if (level == 0) {
        PageDesc *pd = *lp;

        for (i = 0; i < V_L2_SIZE; ++i) {
            page_lock(&pd[i]);
            pd[i].first_tb = (uintptr_t)NULL;
            invalidate_page_bitmap(pd + i);
            page_unlock(&pd[i]);
        }
    } else {
        void **pp = *lp;

        for (i = 0; i < V_L2_SIZE; ++i) {
            page_flush_tb_1(uc, level - 1, pp + i);
        }
    }
}